

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

bool __thiscall QFSFileEnginePrivate::seekFdFh(QFSFileEnginePrivate *this,qint64 pos)

{
  QAbstractFileEngine *this_00;
  bool bVar1;
  int iVar2;
  int *piVar3;
  __off64_t _Var4;
  FileError error;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if (this->lastIOCommand == IOFlushCommand) {
    if (-1 < pos) goto LAB_00115800;
  }
  else {
    iVar2 = (*this_00->_vptr_QAbstractFileEngine[4])(this_00);
    bVar1 = false;
    if ((pos < 0) || ((char)iVar2 == '\0')) goto LAB_001158a8;
LAB_00115800:
    if (this->fh == (FILE *)0x0) {
      _Var4 = lseek64(this->fd,pos,0);
      bVar1 = true;
      if (_Var4 != -1) goto LAB_001158a8;
      piVar3 = __errno_location();
      QSystemError::stdString(&local_38,*piVar3);
      error = PositionError;
    }
    else {
      do {
        iVar2 = fseeko64((FILE *)this->fh,pos,0);
        if (iVar2 == 0) {
          bVar1 = true;
          goto LAB_001158a8;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      QSystemError::stdString(&local_38,*piVar3);
      error = ReadError;
    }
    QAbstractFileEngine::setError(this_00,error,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar1 = false;
LAB_001158a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QFSFileEnginePrivate::seekFdFh(qint64 pos)
{
    Q_Q(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (lastIOCommand != QFSFileEnginePrivate::IOFlushCommand && !q->flush())
        return false;

    if (pos < 0 || pos != qint64(QT_OFF_T(pos)))
        return false;

    if (fh) {
        // Buffered stdlib mode.
        int ret;
        do {
            ret = QT_FSEEK(fh, QT_OFF_T(pos), SEEK_SET);
        } while (ret != 0 && errno == EINTR);

        if (ret != 0) {
            q->setError(QFile::ReadError, QSystemError::stdString(errno));
            return false;
        }
    } else {
        // Unbuffered stdio mode.
        if (QT_LSEEK(fd, QT_OFF_T(pos), SEEK_SET) == -1) {
            q->setError(QFile::PositionError, QSystemError::stdString(errno));
            qWarning("QFile::at: Cannot set file position %lld", pos);
            return false;
        }
    }
    return true;
}